

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_segmark_enc(opj_mqc_t *mqc)

{
  uint local_14;
  OPJ_UINT32 i;
  opj_mqc_t *mqc_local;
  
  mqc->curctx = mqc->ctxs + 0x12;
  for (local_14 = 1; local_14 < 5; local_14 = local_14 + 1) {
    opj_mqc_encode(mqc,local_14 & 1);
  }
  return;
}

Assistant:

void opj_mqc_segmark_enc(opj_mqc_t *mqc)
{
    OPJ_UINT32 i;
    opj_mqc_setcurctx(mqc, 18);

    for (i = 1; i < 5; i++) {
        opj_mqc_encode(mqc, i % 2);
    }
}